

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

int HFSubConsumer::waitTimer(zloop_t *loop,int timer_id,void *arg)

{
  long in_RDX;
  HFSubConsumer *self;
  
  if ((*(byte *)(in_RDX + 0x3b0) & 1) != 0) {
    *(undefined1 *)(in_RDX + 0x3b0) = 0;
    zstr_send(*(void **)(in_RDX + 0xa0),"X");
  }
  return 0;
}

Assistant:

int HFSubConsumer::waitTimer(zloop_t *loop, int timer_id, void *arg){
    //If timeout happens before message comes in
    HFSubConsumer *self = (HFSubConsumer*)arg;
    if(self->waiting){
        self->waiting = false;
        zstr_send(self->usrpipe, "X");
    }
    return 0;
}